

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

longlong * __thiscall JSON::JSONValue::getIntValue(JSONValue *this)

{
  ostream *poVar1;
  string sStack_38;
  
  if (this->type != INTEGER) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON int value from ");
    getTypeAsString_abi_cxx11_(&sStack_38,this);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return (longlong *)this->data;
}

Assistant:

const long long int &JSONValue::getIntValue() const {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=INTEGER)
	cerr << "Error requesting JSON int value from " << getTypeAsString() << endl;
#endif

	return *((long long int*)data);
}